

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  bool bVar1;
  uint uVar2;
  void *workspace_00;
  ulong uVar3;
  FSE_CTable *pFVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  BYTE *ostart;
  char *buffer;
  FSE_CTable *normalizedCounter;
  char *dst_00;
  ulong srcSize;
  uint local_70;
  uint local_6c;
  uint *local_68;
  void *local_60;
  char *local_58;
  size_t local_50;
  FSE_CTable *local_48;
  size_t local_40;
  size_t local_38;
  
  local_58 = (char *)dst;
  local_50 = maxDstSize;
  workspace_00 = HUF_alignUpWorkspace(workspace,&workspaceSize,4);
  if (workspaceSize < 0x2ec) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace_00 + 0x1e0) = 0;
  uVar2 = huffLog + 1;
  if (1 < uVar2) {
    lVar6 = 0;
    do {
      *(char *)((long)workspace_00 + lVar6 + 0x1e1) = (char)huffLog;
      lVar6 = lVar6 + 1;
      huffLog = (uint)(byte)((char)huffLog - 1);
    } while ((ulong)uVar2 - 1 != lVar6);
  }
  srcSize = (ulong)maxSymbolValue;
  if (maxSymbolValue != 0) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)workspace_00 + uVar3 + 0x1ed) =
           *(undefined1 *)((long)workspace_00 + (ulong)(byte)CTable[uVar3 + 1] + 0x1e0);
      uVar3 = uVar3 + 1;
    } while (srcSize != uVar3);
  }
  if (local_50 == 0) {
    return 0xffffffffffffffba;
  }
  buffer = local_58 + 1;
  local_60 = (void *)((long)workspace_00 + 0x1ed);
  local_38 = 0x1e0;
  local_70 = 0xc;
  pFVar4 = (FSE_CTable *)HUF_alignUpWorkspace(workspace_00,&local_38,4);
  uVar3 = 0xffffffffffffffff;
  if (0x1df < local_38) {
    if (maxSymbolValue < 2) {
      uVar3 = 0;
    }
    else {
      local_68 = pFVar4 + 100;
      uVar2 = HIST_count_simple(local_68,&local_70,local_60,srcSize);
      uVar7 = (ulong)(uVar2 == maxSymbolValue);
      uVar3 = uVar7;
      if (uVar2 != maxSymbolValue && uVar2 != 1) {
        local_6c = FSE_optimalTableLog(6,srcSize,local_70);
        normalizedCounter = pFVar4 + 0x71;
        local_48 = pFVar4;
        uVar3 = FSE_normalizeCount((short *)normalizedCounter,local_6c,local_68,srcSize,local_70,0);
        if (uVar3 < 0xffffffffffffff89) {
          local_40 = local_50 - 1;
          local_68 = normalizedCounter;
          sVar5 = FSE_writeNCount(buffer,local_40,(short *)normalizedCounter,local_70,local_6c);
          uVar3 = sVar5;
          if ((sVar5 < 0xffffffffffffff89) &&
             (uVar3 = FSE_buildCTable_wksp
                                (local_48,(short *)local_68,local_70,local_6c,local_48 + 0x3b,0xa4),
             uVar3 < 0xffffffffffffff89)) {
            dst_00 = buffer + sVar5;
            uVar3 = FSE_compress_usingCTable(dst_00,local_40 - sVar5,local_60,srcSize,local_48);
            if (uVar3 < 0xffffffffffffff89) {
              if (uVar3 == 0) {
                bVar1 = false;
                uVar3 = 0;
              }
              else {
                dst_00 = dst_00 + uVar3;
                bVar1 = true;
                uVar3 = uVar7;
              }
            }
            else {
              bVar1 = false;
            }
            if (bVar1) {
              uVar3 = (long)dst_00 - (long)buffer;
            }
          }
        }
      }
    }
  }
  if (uVar3 < 0xffffffffffffff89) {
    if (maxSymbolValue >> 1 <= uVar3 || uVar3 < 2) {
      bVar1 = true;
      goto LAB_00219807;
    }
    *local_58 = (char)uVar3;
    uVar3 = uVar3 + 1;
  }
  bVar1 = false;
LAB_00219807:
  if ((bVar1) && (uVar3 = 0xffffffffffffffff, maxSymbolValue < 0x81)) {
    uVar7 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar3 = 0xffffffffffffffba;
    if (uVar7 <= local_50) {
      *local_58 = (char)maxSymbolValue + '\x7f';
      *(undefined1 *)((long)local_60 + srcSize) = 0;
      uVar3 = uVar7;
      if (maxSymbolValue != 0) {
        uVar7 = 0;
        do {
          *buffer = *(char *)((long)workspace_00 + uVar7 + 0x1ed) * '\x10' +
                    *(char *)((long)workspace_00 + uVar7 + 0x1ee);
          uVar7 = uVar7 + 2;
          buffer = buffer + 1;
        } while (uVar7 < srcSize);
      }
    }
  }
  return uVar3;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    HUF_CElt const* const ct = CTable + 1;
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)HUF_alignUpWorkspace(workspace, &workspaceSize, ZSTD_ALIGNOF(U32));

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE >= sizeof(HUF_WriteCTableWksp));

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[HUF_getNbBits(ct[n])];

    /* attempt weights compression by FSE */
    if (maxDstSize < 1) return ERROR(dstSize_tooSmall);
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}